

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UObject * __thiscall
icu_63::BasicCalendarFactory::create
          (BasicCalendarFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  int8_t iVar1;
  char16_t cVar2;
  int32_t iVar3;
  ECalType EVar4;
  Calendar *pCVar5;
  long lVar6;
  ConstChar16Ptr local_310;
  char16_t *local_308;
  UnicodeString str;
  UnicodeString calendarKeyword;
  char keyword [157];
  Locale canLoc;
  Locale curLoc;
  
  Locale::Locale(&curLoc);
  Locale::Locale(&canLoc);
  (*(key->super_UObject)._vptr_UObject[0xc])(key,&curLoc);
  (*(key->super_UObject)._vptr_UObject[0xb])(key,&canLoc);
  str.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  str.fUnion.fStackFields.fLengthAndFlags = 2;
  (*(key->super_UObject)._vptr_UObject[5])(key);
  local_310.p_ = L"calendar=";
  UnicodeString::UnicodeString(&calendarKeyword,'\x01',&local_310,-1);
  local_308 = local_310.p_;
  if (-1 < calendarKeyword.fUnion.fStackFields.fLengthAndFlags) {
    calendarKeyword.fUnion.fFields.fLength =
         (int)calendarKeyword.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar3 = UnicodeString::indexOf(&str,L'=');
  cVar2 = UnicodeString::doCharAt(&str,0);
  if (cVar2 == L'@') {
    iVar1 = UnicodeString::compareBetween
                      (&str,1,iVar3 + 1,&calendarKeyword,0,calendarKeyword.fUnion.fFields.fLength);
    if (iVar1 == '\0') {
      if (-1 < str.fUnion.fStackFields.fLengthAndFlags) {
        str.fUnion.fFields.fLength = (int)str.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar3 = UnicodeString::extract
                        (&str,iVar3 + 1,str.fUnion.fFields.fLength,keyword,0x9d,kInvariant);
      lVar6 = (long)iVar3;
      goto LAB_001eb876;
    }
  }
  lVar6 = 0;
LAB_001eb876:
  keyword[lVar6] = '\0';
  UnicodeString::~UnicodeString(&calendarKeyword);
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (EVar4 = getCalendarType(keyword), EVar4 != CALTYPE_UNKNOWN)) {
    EVar4 = getCalendarType(keyword);
    pCVar5 = createStandardCalendar(EVar4,&canLoc,status);
  }
  else {
    pCVar5 = (Calendar *)0x0;
  }
  UnicodeString::~UnicodeString(&str);
  Locale::~Locale(&canLoc);
  Locale::~Locale(&curLoc);
  return &pCVar5->super_UObject;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* /*service*/, UErrorCode& status) const {
#ifdef U_DEBUG_CALSVC
        if(dynamic_cast<const LocaleKey*>(&key) == NULL) {
            fprintf(stderr, "::create - not a LocaleKey!\n");
        }
#endif
        const LocaleKey& lkey = (LocaleKey&)key;
        Locale curLoc;  // current locale
        Locale canLoc;  // Canonical locale

        lkey.currentLocale(curLoc);
        lkey.canonicalLocale(canLoc);

        char keyword[ULOC_FULLNAME_CAPACITY];
        UnicodeString str;

        key.currentID(str);
        getCalendarKeyword(str, keyword, (int32_t) sizeof(keyword));

#ifdef U_DEBUG_CALSVC
        fprintf(stderr, "BasicCalendarFactory::create() - cur %s, can %s\n", (const char*)curLoc.getName(), (const char*)canLoc.getName());
#endif

        if(!isStandardSupportedKeyword(keyword,status)) {  // Do we handle this type?
#ifdef U_DEBUG_CALSVC

            fprintf(stderr, "BasicCalendarFactory - not handling %s.[%s]\n", (const char*) curLoc.getName(), tmp );
#endif
            return NULL;
        }

        return createStandardCalendar(getCalendarType(keyword), canLoc, status);
    }